

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall Builder::Cleanup(Builder *this)

{
  DiskInterface *pDVar1;
  bool bVar2;
  int iVar3;
  pointer pCVar4;
  reference ppEVar5;
  reference ppNVar6;
  string *psVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  TimeStamp TVar9;
  ulong uVar10;
  TimeStamp new_mtime;
  string err;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_70;
  iterator o;
  string depfile;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_40;
  iterator e;
  undefined1 local_28 [8];
  vector<Edge_*,_std::allocator<Edge_*>_> active_edges;
  Builder *this_local;
  
  active_edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  pCVar4 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::get
                     (&this->command_runner_);
  if (pCVar4 != (pointer)0x0) {
    pCVar4 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    (*pCVar4->_vptr_CommandRunner[5])(local_28);
    pCVar4 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    (*pCVar4->_vptr_CommandRunner[6])();
    local_40._M_current =
         (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)local_28);
    while( true ) {
      depfile.field_2._8_8_ =
           std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                     ((vector<Edge_*,_std::allocator<Edge_*>_> *)local_28);
      bVar2 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)((long)&depfile.field_2 + 8));
      if (!bVar2) break;
      ppEVar5 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                ::operator*(&local_40);
      Edge::GetUnescapedDepfile_abi_cxx11_((string *)&o,*ppEVar5);
      ppEVar5 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                ::operator*(&local_40);
      local_70._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar5)->outputs_);
      while( true ) {
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_40);
        err.field_2._8_8_ = std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar5)->outputs_)
        ;
        bVar2 = __gnu_cxx::operator!=
                          (&local_70,
                           (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                            *)((long)&err.field_2 + 8));
        if (!bVar2) break;
        std::__cxx11::string::string((string *)&new_mtime);
        pDVar1 = this->disk_interface_;
        ppNVar6 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_70);
        psVar7 = Node::path_abi_cxx11_(*ppNVar6);
        iVar3 = (*(pDVar1->super_FileReader)._vptr_FileReader[3])(pDVar1,psVar7,&new_mtime);
        if (CONCAT44(extraout_var,iVar3) == -1) {
          uVar8 = std::__cxx11::string::c_str();
          Error("%s",uVar8);
        }
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
LAB_001ccb02:
          pDVar1 = this->disk_interface_;
          ppNVar6 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_70);
          psVar7 = Node::path_abi_cxx11_(*ppNVar6);
          (*(pDVar1->super_FileReader)._vptr_FileReader[6])(pDVar1,psVar7);
        }
        else {
          ppNVar6 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_70);
          TVar9 = Node::mtime(*ppNVar6);
          if (TVar9 != CONCAT44(extraout_var,iVar3)) goto LAB_001ccb02;
        }
        std::__cxx11::string::~string((string *)&new_mtime);
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_70);
      }
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        (*(this->disk_interface_->super_FileReader)._vptr_FileReader[6])(this->disk_interface_,&o);
      }
      std::__cxx11::string::~string((string *)&o);
      __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_40);
    }
    std::vector<Edge_*,_std::allocator<Edge_*>_>::~vector
              ((vector<Edge_*,_std::allocator<Edge_*>_> *)local_28);
  }
  return;
}

Assistant:

void Builder::Cleanup() {
  if (command_runner_.get()) {
    vector<Edge*> active_edges = command_runner_->GetActiveEdges();
    command_runner_->Abort();

    for (vector<Edge*>::iterator e = active_edges.begin();
         e != active_edges.end(); ++e) {
      string depfile = (*e)->GetUnescapedDepfile();
      for (vector<Node*>::iterator o = (*e)->outputs_.begin();
           o != (*e)->outputs_.end(); ++o) {
        // Only delete this output if it was actually modified.  This is
        // important for things like the generator where we don't want to
        // delete the manifest file if we can avoid it.  But if the rule
        // uses a depfile, always delete.  (Consider the case where we
        // need to rebuild an output because of a modified header file
        // mentioned in a depfile, and the command touches its depfile
        // but is interrupted before it touches its output file.)
        string err;
        TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), &err);
        if (new_mtime == -1)  // Log and ignore Stat() errors.
          Error("%s", err.c_str());
        if (!depfile.empty() || (*o)->mtime() != new_mtime)
          disk_interface_->RemoveFile((*o)->path());
      }
      if (!depfile.empty())
        disk_interface_->RemoveFile(depfile);
    }
  }
}